

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O1

void minimalSwapAndFlipIVar_superFast_moreThen5
               (word *pInOut,int iVar,int nWords,char *pCanonPerm,uint *pCanonPhase)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint iQ;
  int M [2];
  int DifStart1;
  int DifStart0;
  int DifStartMin;
  word temp [1024];
  
  uVar2 = minTemp0_fast_moreThen5(pInOut,iVar,nWords,&DifStart0);
  M[0] = uVar2;
  uVar3 = minTemp1_fast_moreThen5(pInOut,iVar,nWords,&DifStart1);
  M[1] = uVar3;
  uVar4 = minTemp2_fast_moreThen5(pInOut,iVar,uVar2,uVar3,nWords,&DifStartMin);
  if (DifStart0 == DifStart1) {
    if (DifStart0 <= DifStartMin) goto LAB_00562391;
    uVar2 = minTemp3_fast_moreThen5
                      (pInOut,iVar,DifStart0,DifStartMin,uVar2 ^ 3,uVar3 ^ 3,&DifStart1);
    if (DifStartMin < DifStart1) {
      iQ = M[uVar2 ^ 1];
      uVar2 = M[uVar2];
      DifStartMin = DifStart0;
    }
    else {
      iQ = M[uVar4];
      uVar2 = M[uVar4 ^ 1];
      DifStartMin = DifStart0;
    }
  }
  else {
    if (DifStartMin < DifStart0 || DifStartMin < DifStart1) {
      if (DifStart1 < DifStart0) {
        iQ = uVar2;
        uVar2 = uVar3;
        iVar1 = DifStart0;
        if (DifStart0 < DifStartMin) {
          iVar1 = DifStartMin;
        }
      }
      else {
        iQ = uVar3;
        iVar1 = DifStart1;
        if (DifStart1 < DifStartMin) {
          iVar1 = DifStartMin;
        }
      }
      DifStartMin = iVar1;
      uVar3 = iQ ^ 3;
      uVar4 = uVar2 ^ 3;
      goto LAB_0056241f;
    }
LAB_00562391:
    iQ = M[uVar4];
    uVar2 = M[uVar4 ^ 1];
  }
  uVar3 = 3 - iQ;
  uVar4 = 3 - uVar2;
LAB_0056241f:
  arrangeQuoters_superFast_moreThen5
            (pInOut,temp,DifStartMin,iQ,uVar2,uVar4,uVar3,iVar,pCanonPerm,pCanonPhase);
  return;
}

Assistant:

void minimalSwapAndFlipIVar_superFast_moreThen5(word* pInOut, int iVar, int nWords, char * pCanonPerm, unsigned* pCanonPhase)
{
    int min1, min2, DifStart0, DifStart1, DifStartMin;
    int M[2];
    word temp[1024];
//    printf("in minimalSwapAndFlipIVar_superFast_moreThen5\n");
    M[0] = minTemp0_fast_moreThen5(pInOut, iVar, nWords, &DifStart0); // 0, 3
    M[1] = minTemp1_fast_moreThen5(pInOut, iVar, nWords, &DifStart1); // 1, 2
    min1 = minTemp2_fast_moreThen5(pInOut, iVar, M[0], M[1], nWords, &DifStartMin);
    if(DifStart0 != DifStart1)
    {   
        if( DifStartMin>=DifStart1 && DifStartMin>=DifStart0 )
            arrangeQuoters_superFast_moreThen5(pInOut, temp, DifStartMin, M[min1], M[(min1+1)&1], 3 - M[(min1+1)&1], 3 - M[min1], iVar, pCanonPerm, pCanonPhase);
        else if( DifStart0 > DifStart1)
            arrangeQuoters_superFast_moreThen5(pInOut, temp, luckyMax(DifStartMin,DifStart0), M[0], M[1], 3 - M[1], 3 - M[0], iVar, pCanonPerm, pCanonPhase);
        else
            arrangeQuoters_superFast_moreThen5(pInOut, temp, luckyMax(DifStartMin,DifStart1), M[1], M[0], 3 - M[0], 3 - M[1], iVar, pCanonPerm, pCanonPhase);
    }
    else
    {
        if(DifStartMin>=DifStart0)
            arrangeQuoters_superFast_moreThen5(pInOut, temp, DifStartMin, M[min1], M[(min1+1)&1], 3 - M[(min1+1)&1], 3 - M[min1], iVar, pCanonPerm, pCanonPhase);
        else
        {
            min2 = minTemp3_fast_moreThen5(pInOut, iVar, DifStart0, DifStartMin, 3-M[0], 3-M[1], &DifStart1);  // reuse DifStart1 because DifStart1 = DifStart1=0
            if(DifStart1>DifStartMin)
                arrangeQuoters_superFast_moreThen5(pInOut, temp, DifStart0, M[(min2+1)&1], M[min2], 3 - M[min2], 3 - M[(min2+1)&1], iVar, pCanonPerm, pCanonPhase);
            else
                arrangeQuoters_superFast_moreThen5(pInOut, temp, DifStart0, M[min1], M[(min1+1)&1], 3 - M[(min1+1)&1], 3 - M[min1], iVar, pCanonPerm, pCanonPhase);
        }
    }
//    printf("out minimalSwapAndFlipIVar_superFast_moreThen5\n");

}